

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O0

void __thiscall
slang::ast::CaseStatement::visitStmts<slang::ast::UnrollVisitor&>
          (CaseStatement *this,UnrollVisitor *visitor)

{
  bool bVar1;
  iterator this_00;
  iterator visitor_00;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *in_RDI;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *__range3;
  reference in_stack_ffffffffffffffd0;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>
  *in_stack_ffffffffffffffd8;
  
  this_00 = std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::begin
                      (in_RDI);
  visitor_00 = std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::end
                         (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
         ::operator*((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                      *)&stack0xffffffffffffffe0);
    not_null<const_slang::ast::Statement_*>::operator->
              ((not_null<const_slang::ast::Statement_*> *)0xa70a02);
    Statement::visit<slang::ast::UnrollVisitor&>
              ((Statement *)this_00._M_current,(UnrollVisitor *)visitor_00._M_current);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffe0);
  }
  if (in_RDI[3]._M_extent._M_extent_value != 0) {
    Statement::visit<slang::ast::UnrollVisitor&>
              ((Statement *)this_00._M_current,(UnrollVisitor *)visitor_00._M_current);
  }
  return;
}

Assistant:

void visitStmts(TVisitor&& visitor) const {
        for (auto& item : items)
            item.stmt->visit(visitor);
        if (defaultCase)
            defaultCase->visit(visitor);
    }